

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

bool cal_run(void)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *this;
  void *this_00;
  int *piVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8 [2];
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> local_98;
  Plane *local_90;
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> local_88;
  int local_80;
  int local_7c;
  Plane *local_78;
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> local_70;
  reference local_68;
  Plane *tplane;
  int local_58;
  int i_2;
  int local_50;
  int i_1;
  int i;
  float tAS;
  __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> local_40;
  int local_38;
  int local_34;
  int maxFighterNum;
  int minFighterNum;
  __normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_> local_28;
  int local_20;
  int local_1c;
  int planeSz;
  int gridSz;
  time_point starttime;
  
  logtime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  _planeSz = logtime.__d.__r;
  sVar3 = std::vector<Grid,_std::allocator<Grid>_>::size(&gridVec);
  local_1c = (int)sVar3;
  sVar3 = std::vector<Plane,_std::allocator<Plane>_>::size(&planeVec);
  local_20 = (int)sVar3;
  local_28._M_current = (Grid *)std::vector<Grid,_std::allocator<Grid>_>::begin(&gridVec);
  _maxFighterNum = std::vector<Grid,_std::allocator<Grid>_>::end(&gridVec);
  std::
  sort<__gnu_cxx::__normal_iterator<Grid*,std::vector<Grid,std::allocator<Grid>>>,bool(*)(Grid_const&,Grid_const&)>
            (local_28,(__normal_iterator<Grid_*,_std::vector<Grid,_std::allocator<Grid>_>_>)
                      _maxFighterNum,cal_cmp_grid);
  local_34 = -1;
  local_38 = 0;
  local_40._M_current = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::begin(&planeVec);
  _i = std::vector<Plane,_std::allocator<Plane>_>::end(&planeVec);
  std::
  sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,bool(*)(Plane_const&,Plane_const&)>
            (local_40,(__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)_i,
             cal_cmp_plane_AS);
  i_1 = 0x42480000;
  if ((float)tarAirSupremacy <= 50.0) {
    local_34 = 0;
  }
  for (local_50 = 0; local_50 < local_1c && local_50 < local_20; local_50 = local_50 + 1) {
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)local_50);
    iVar1 = 3;
    if (pvVar4->category == 3) {
      iVar1 = 0x19;
    }
    pvVar5 = std::vector<Grid,_std::allocator<Grid>_>::operator[](&gridVec,(long)local_50);
    iVar2 = pvVar5->gridSize;
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)local_50);
    iVar2 = formulaFighter(iVar2,pvVar4->airSupremacy);
    i_1 = (int)((float)(iVar1 + iVar2) + (float)i_1);
    if (((float)tarAirSupremacy <= (float)i_1) && (local_34 == -1)) {
      local_34 = local_50 + 1;
    }
  }
  i_1 = 0;
  for (i_2 = 0; i_2 < local_1c && i_2 < local_20; i_2 = i_2 + 1) {
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)i_2);
    if (pvVar4->category == 3) {
      local_38 = local_38 + 1;
      pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)i_2);
      std::vector<Plane,_std::allocator<Plane>_>::push_back(&planeVecF,pvVar4);
    }
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)i_2);
    iVar1 = 3;
    if (pvVar4->category == 3) {
      iVar1 = 0x19;
    }
    pvVar5 = std::vector<Grid,_std::allocator<Grid>_>::operator[](&gridVec,(long)i_2);
    iVar2 = pvVar5->gridSize;
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVec,(long)i_2);
    iVar2 = formulaFighter(iVar2,pvVar4->airSupremacy);
    i_1 = (int)((float)(iVar1 + iVar2) + (float)i_1);
  }
  if ((float)tarAirSupremacy <= (float)i_1) {
    local_58 = 0x10;
    piVar6 = std::min<int>(&local_38,&local_58);
    local_38 = *piVar6;
    piVar6 = std::min<int>(&local_34,&local_38);
    curFighterNum = *piVar6;
    local_34 = curFighterNum;
    for (; curFighterNum <= local_38; curFighterNum = curFighterNum + 1) {
      std::vector<Plane,_std::allocator<Plane>_>::clear(&planeVecA);
      for (tplane._4_4_ = 0; tplane._4_4_ < local_20; tplane._4_4_ = tplane._4_4_ + 1) {
        local_68 = std::vector<Plane,_std::allocator<Plane>_>::operator[]
                             (&planeVec,(long)tplane._4_4_);
        if ((local_68->category == 2) || (local_68->category == 1)) {
          std::vector<Plane,_std::allocator<Plane>_>::push_back(&planeVecA,local_68);
        }
      }
      local_70._M_current = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::begin(&planeVecA);
      local_78 = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::end(&planeVecA);
      std::
      sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,bool(*)(Plane_const&,Plane_const&)>
                (local_70,(__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                          local_78,cal_cmp_plane_damage);
      local_7c = local_1c - curFighterNum;
      sVar3 = std::vector<Plane,_std::allocator<Plane>_>::size(&planeVecA);
      local_80 = (int)sVar3;
      piVar6 = std::min<int>(&local_7c,&local_80);
      curBomberNum = *piVar6;
      piVar6 = std::min<int>(&curBomberNum,&attackerAbleGridNum);
      curBomberNum = *piVar6;
      flushFlag = true;
      local_88._M_current = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::begin(&planeVecA);
      local_98._M_current = (Plane *)std::vector<Plane,_std::allocator<Plane>_>::begin(&planeVecA);
      local_90 = (Plane *)__gnu_cxx::
                          __normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
                          operator+(&local_98,(long)curBomberNum);
      std::
      sort<__gnu_cxx::__normal_iterator<Plane*,std::vector<Plane,std::allocator<Plane>>>,bool(*)(Plane_const&,Plane_const&)>
                (local_88,(__normal_iterator<Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                          local_90,cal_cmp_plane_damageOP);
      atkdp(curBomberNum);
      memset(sign,0,0x80);
      baoliSearch(0,curFighterNum,curBomberNum,local_1c);
    }
    local_b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_a8[0].__r =
         (rep)std::chrono::operator-
                        (&local_b0,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&planeSz);
    restime.__r = (rep)std::chrono::
                       duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                 (local_a8);
    starttime.__d.__r._7_1_ = true;
  }
  else {
    this = std::operator<<((ostream *)&std::cout,
                           "ERROR:FighterPower unreachable.Currently reachable FighterPower: ");
    this_00 = (void *)std::ostream::operator<<(this,(float)i_1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    starttime.__d.__r._7_1_ = false;
  }
  return starttime.__d.__r._7_1_;
}

Assistant:

bool cal_run(){//if available result
    auto starttime=std::chrono::system_clock::now();
    logtime=starttime;
    //prepare
    int gridSz=gridVec.size(),planeSz=planeVec.size();
    sort(gridVec.begin(),gridVec.end(),cal_cmp_grid);

    //choose fighters.
    int minFighterNum=-1,maxFighterNum=0;

    sort(planeVec.begin(),planeVec.end(),cal_cmp_plane_AS);

    //cal min
    float tAS=PRESET_AS_OF_BOMBER;//AirSupermacy Val
    if(tAS>=tarAirSupremacy)minFighterNum=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
        if(tAS>=tarAirSupremacy&&minFighterNum==-1){
            minFighterNum=i+1;
        }
    }
    //cal max
    tAS=0;
    for(int i=0;i<gridSz&&i<planeSz;i++){
        if(planeVec[i].category == PLANE_FIGHTER){
            maxFighterNum++;
            planeVecF.push_back(planeVec[i]);
        }
        tAS+=AS_PROF_BONOUS(planeVec[i])+formulaFighter(gridVec[i].gridSize,planeVec[i].airSupremacy);
    }
    if(tAS<tarAirSupremacy){
        cout<<"ERROR:FighterPower unreachable.Currently reachable FighterPower: "<<tAS<<endl;
        return false;
    }
    maxFighterNum=min(maxFighterNum,16);
    minFighterNum = min(minFighterNum, maxFighterNum);

    //for all possibility
    for(curFighterNum=minFighterNum;curFighterNum<=maxFighterNum;curFighterNum++){
        //choose bombers.
        planeVecA.clear();
        for(int i=0;i<planeSz;i++){
            Plane &tplane=planeVec[i];
            if(tplane.category==PLANE_BOMBER||tplane.category==PLANE_TORPEDO_ATTACKER)
                planeVecA.push_back(tplane);
        }
        sort(planeVecA.begin(),planeVecA.end(),cal_cmp_plane_damage);
        curBomberNum=min(gridSz-curFighterNum,(int)planeVecA.size());
        curBomberNum=min(curBomberNum,attackerAbleGridNum);
        flushFlag=1;//if copy resVecA
//        cout<<curBomberNum<<endl;
//        if(curBomberNum>CBN_LIMIT){
//            cout<<"ERROR:Too much bomber, curBomberNum: "<<curBomberNum<<"  LIMIT: "<<CBN_LIMIT-1<<endl;
//            return false;
//        }

//        cout<<curBomberNum<<endl;
        sort(planeVecA.begin(),planeVecA.begin()+curBomberNum,cal_cmp_plane_damageOP);

        //dfs all bombers assignments
        atkdp(curBomberNum);
//        cout<<"dp finished"<<endl;
        // 0-1 search
        memset(sign,0,sizeof(sign));
        baoliSearch(0,curFighterNum,curBomberNum,gridSz);
    }
    restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now() - starttime);

    return true;
}